

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerCommitPhaseOne(Pager *pPager,char *zMaster,int noSync)

{
  uint uVar1;
  sqlite3_file *fd;
  int iVar2;
  PgHdr *pPVar3;
  u32 val;
  long lVar4;
  u32 val_00;
  PgHdr *pPageOne;
  long local_38;
  
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
     (iVar2 = (*sqlite3Config.xTestCallback)(400), iVar2 != 0)) {
    return 10;
  }
  if (pPager->eState < 3) {
    return 0;
  }
  iVar2 = pagerFlushOnCommit(pPager,1);
  if (iVar2 == 0) {
    sqlite3BackupRestart(pPager->pBackup);
  }
  else {
    if (pPager->pWal == (Wal *)0x0) {
      if ((pPager->changeCountDone == '\0') && (pPager->dbSize != 0)) {
        iVar2 = (*pPager->xGet)(pPager,1,&pPageOne,0);
        if ((iVar2 == 0) && (iVar2 = sqlite3PagerWrite(pPageOne), iVar2 == 0)) {
          pager_write_changecounter(pPageOne);
          pPager->changeCountDone = '\x01';
          iVar2 = 0;
        }
        sqlite3PagerUnref(pPageOne);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      if (((zMaster != (char *)0x0) && (pPager->journalMode != '\x04')) &&
         (fd = pPager->jfd, fd->pMethods != (sqlite3_io_methods *)0x0)) {
        pPager->setMaster = '\x01';
        val_00 = 0;
        for (lVar4 = 0; zMaster[lVar4] != '\0'; lVar4 = lVar4 + 1) {
          val_00 = val_00 + (int)zMaster[lVar4];
        }
        if (pPager->fullSync == '\0') {
          local_38 = pPager->journalOff;
        }
        else {
          local_38 = journalHdrOffset(pPager);
          pPager->journalOff = local_38;
        }
        iVar2 = write32bits(fd,local_38,sqlite3PendingByte / pPager->pageSize + 1);
        if (iVar2 != 0) {
          return iVar2;
        }
        val = (u32)lVar4;
        iVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,zMaster,val,local_38 + 4);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = write32bits(pPager->jfd,local_38 + lVar4 + 4,val);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = write32bits(pPager->jfd,local_38 + lVar4 + 8,val_00);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,aJournalMagic,8,local_38 + lVar4 + 0xc)
        ;
        if (iVar2 != 0) {
          return iVar2;
        }
        pPager->journalOff = pPager->journalOff + (ulong)(val + 0x14);
        iVar2 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&pPageOne);
        if (iVar2 != 0) {
          return iVar2;
        }
        if ((pPager->journalOff < (long)pPageOne) &&
           (iVar2 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,pPager->journalOff), iVar2 != 0)
           ) {
          return iVar2;
        }
      }
      iVar2 = syncJournal(pPager,0);
      if (iVar2 != 0) {
        return iVar2;
      }
      pPVar3 = sqlite3PcacheDirtyList(pPager->pPCache);
      iVar2 = pager_write_pagelist(pPager,pPVar3);
      if (iVar2 != 0) {
        return iVar2;
      }
      sqlite3PcacheCleanAll(pPager->pPCache);
      uVar1 = pPager->dbSize;
      if ((pPager->dbFileSize < uVar1) &&
         (iVar2 = pager_truncate(pPager,uVar1 - (uVar1 == sqlite3PendingByte / pPager->pageSize + 1U
                                                )), iVar2 != 0)) {
        return iVar2;
      }
      if (noSync != 0) goto LAB_001176f8;
      iVar2 = sqlite3PagerSync(pPager,zMaster);
    }
    else {
      pPVar3 = sqlite3PcacheDirtyList(pPager->pPCache);
      pPageOne = (PgHdr *)0x0;
      if (pPVar3 == (PgHdr *)0x0) {
        (*pPager->xGet)(pPager,1,&pPageOne,0);
        pPageOne->pDirty = (PgHdr *)0x0;
        pPVar3 = pPageOne;
      }
      iVar2 = pagerWalFrames(pPager,pPVar3,pPager->dbSize,1);
      sqlite3PagerUnref(pPageOne);
      if (iVar2 == 0) {
        sqlite3PcacheCleanAll(pPager->pPCache);
      }
    }
    if (iVar2 != 0) {
      return iVar2;
    }
  }
LAB_001176f8:
  if (pPager->pWal == (Wal *)0x0) {
    pPager->eState = '\x05';
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerCommitPhaseOne(
  Pager *pPager,                  /* Pager object */
  const char *zMaster,            /* If not NULL, the master journal name */
  int noSync                      /* True to omit the xSync on the db file */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
       || pPager->eState==PAGER_ERROR
  );
  assert( assert_pager_state(pPager) );

  /* If a prior error occurred, report that error again. */
  if( NEVER(pPager->errCode) ) return pPager->errCode;

  /* Provide the ability to easily simulate an I/O error during testing */
  if( sqlite3FaultSim(400) ) return SQLITE_IOERR;

  PAGERTRACE(("DATABASE SYNC: File=%s zMaster=%s nSize=%d\n", 
      pPager->zFilename, zMaster, pPager->dbSize));

  /* If no database changes have been made, return early. */
  if( pPager->eState<PAGER_WRITER_CACHEMOD ) return SQLITE_OK;

  assert( MEMDB==0 || pPager->tempFile );
  assert( isOpen(pPager->fd) || pPager->tempFile );
  if( 0==pagerFlushOnCommit(pPager, 1) ){
    /* If this is an in-memory db, or no pages have been written to, or this
    ** function has already been called, it is mostly a no-op.  However, any
    ** backup in progress needs to be restarted.  */
    sqlite3BackupRestart(pPager->pBackup);
  }else{
    if( pagerUseWal(pPager) ){
      PgHdr *pList = sqlite3PcacheDirtyList(pPager->pPCache);
      PgHdr *pPageOne = 0;
      if( pList==0 ){
        /* Must have at least one page for the WAL commit flag.
        ** Ticket [2d1a5c67dfc2363e44f29d9bbd57f] 2011-05-18 */
        rc = sqlite3PagerGet(pPager, 1, &pPageOne, 0);
        pList = pPageOne;
        pList->pDirty = 0;
      }
      assert( rc==SQLITE_OK );
      if( ALWAYS(pList) ){
        rc = pagerWalFrames(pPager, pList, pPager->dbSize, 1);
      }
      sqlite3PagerUnref(pPageOne);
      if( rc==SQLITE_OK ){
        sqlite3PcacheCleanAll(pPager->pPCache);
      }
    }else{
      /* The following block updates the change-counter. Exactly how it
      ** does this depends on whether or not the atomic-update optimization
      ** was enabled at compile time, and if this transaction meets the 
      ** runtime criteria to use the operation: 
      **
      **    * The file-system supports the atomic-write property for
      **      blocks of size page-size, and 
      **    * This commit is not part of a multi-file transaction, and
      **    * Exactly one page has been modified and store in the journal file.
      **
      ** If the optimization was not enabled at compile time, then the
      ** pager_incr_changecounter() function is called to update the change
      ** counter in 'indirect-mode'. If the optimization is compiled in but
      ** is not applicable to this transaction, call sqlite3JournalCreate()
      ** to make sure the journal file has actually been created, then call
      ** pager_incr_changecounter() to update the change-counter in indirect
      ** mode. 
      **
      ** Otherwise, if the optimization is both enabled and applicable,
      ** then call pager_incr_changecounter() to update the change-counter
      ** in 'direct' mode. In this case the journal file will never be
      ** created for this transaction.
      */
  #ifdef SQLITE_ENABLE_ATOMIC_WRITE
      PgHdr *pPg;
      assert( isOpen(pPager->jfd) 
           || pPager->journalMode==PAGER_JOURNALMODE_OFF 
           || pPager->journalMode==PAGER_JOURNALMODE_WAL 
      );
      if( !zMaster && isOpen(pPager->jfd) 
       && pPager->journalOff==jrnlBufferSize(pPager) 
       && pPager->dbSize>=pPager->dbOrigSize
       && (0==(pPg = sqlite3PcacheDirtyList(pPager->pPCache)) || 0==pPg->pDirty)
      ){
        /* Update the db file change counter via the direct-write method. The 
        ** following call will modify the in-memory representation of page 1 
        ** to include the updated change counter and then write page 1 
        ** directly to the database file. Because of the atomic-write 
        ** property of the host file-system, this is safe.
        */
        rc = pager_incr_changecounter(pPager, 1);
      }else{
        rc = sqlite3JournalCreate(pPager->jfd);
        if( rc==SQLITE_OK ){
          rc = pager_incr_changecounter(pPager, 0);
        }
      }
  #else
      rc = pager_incr_changecounter(pPager, 0);
  #endif
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      /* Write the master journal name into the journal file. If a master 
      ** journal file name has already been written to the journal file, 
      ** or if zMaster is NULL (no master journal), then this call is a no-op.
      */
      rc = writeMasterJournal(pPager, zMaster);
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      /* Sync the journal file and write all dirty pages to the database.
      ** If the atomic-update optimization is being used, this sync will not 
      ** create the journal file or perform any real IO.
      **
      ** Because the change-counter page was just modified, unless the
      ** atomic-update optimization is used it is almost certain that the
      ** journal requires a sync here. However, in locking_mode=exclusive
      ** on a system under memory pressure it is just possible that this is 
      ** not the case. In this case it is likely enough that the redundant
      ** xSync() call will be changed to a no-op by the OS anyhow. 
      */
      rc = syncJournal(pPager, 0);
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      rc = pager_write_pagelist(pPager,sqlite3PcacheDirtyList(pPager->pPCache));
      if( rc!=SQLITE_OK ){
        assert( rc!=SQLITE_IOERR_BLOCKED );
        goto commit_phase_one_exit;
      }
      sqlite3PcacheCleanAll(pPager->pPCache);

      /* If the file on disk is smaller than the database image, use 
      ** pager_truncate to grow the file here. This can happen if the database
      ** image was extended as part of the current transaction and then the
      ** last page in the db image moved to the free-list. In this case the
      ** last page is never written out to disk, leaving the database file
      ** undersized. Fix this now if it is the case.  */
      if( pPager->dbSize>pPager->dbFileSize ){
        Pgno nNew = pPager->dbSize - (pPager->dbSize==PAGER_MJ_PGNO(pPager));
        assert( pPager->eState==PAGER_WRITER_DBMOD );
        rc = pager_truncate(pPager, nNew);
        if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
      }
  
      /* Finally, sync the database file. */
      if( !noSync ){
        rc = sqlite3PagerSync(pPager, zMaster);
      }
      IOTRACE(("DBSYNC %p\n", pPager))
    }
  }

commit_phase_one_exit:
  if( rc==SQLITE_OK && !pagerUseWal(pPager) ){
    pPager->eState = PAGER_WRITER_FINISHED;
  }
  return rc;
}